

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O0

void __thiscall
flatbuffers::lobster::LobsterGenerator::StructBuilderArgs
          (LobsterGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  StructDef *struct_def_00;
  bool bVar1;
  reference ppFVar2;
  char *nameprefix_00;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string *local_b8;
  string *code;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  FieldDef *local_40;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_30;
  const_iterator it;
  string *code_ptr_local;
  char *nameprefix_local;
  StructDef *struct_def_local;
  LobsterGenerator *this_local;
  
  it._M_current = (FieldDef **)code_ptr;
  local_30._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppFVar2;
    bVar1 = IsStruct(&(local_40->value).type);
    if (bVar1) {
      struct_def_00 = (local_40->value).type.struct_def;
      NormalizedName_abi_cxx11_(&local_a0,this,&local_40->super_Definition);
      std::operator+(&local_80,&local_a0,"_");
      std::operator+(&local_60,nameprefix,&local_80);
      nameprefix_00 = (char *)std::__cxx11::string::c_str();
      StructBuilderArgs(this,struct_def_00,nameprefix_00,(string *)it._M_current);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      local_b8 = (string *)it._M_current;
      NormalizedName_abi_cxx11_(&local_158,this,&local_40->super_Definition);
      std::operator+(&local_138,nameprefix,&local_158);
      std::operator+(&local_118,", ",&local_138);
      std::operator+(&local_f8,&local_118,":");
      LobsterType_abi_cxx11_(&local_178,this,&(local_40->value).type);
      std::operator+(&local_d8,&local_f8,&local_178);
      std::__cxx11::string::operator+=(local_b8,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

void StructBuilderArgs(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr) {
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;
      if (IsStruct(field.value.type)) {
        // Generate arguments for a struct inside a struct. To ensure names
        // don't clash, and to make it obvious these arguments are constructing
        // a nested struct, prefix the name with the field name.
        StructBuilderArgs(*field.value.type.struct_def,
                          (nameprefix + (NormalizedName(field) + "_")).c_str(),
                          code_ptr);
      } else {
        std::string &code = *code_ptr;
        code += ", " + (nameprefix + NormalizedName(field)) + ":" +
                LobsterType(field.value.type);
      }
    }
  }